

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BindAttributeTest::BindAttributeTest
          (BindAttributeTest *this,TestContext *testCtx,RenderContext *renderCtx,AttribType *type,
          int arraySize)

{
  AttribType *pAVar1;
  string local_70;
  string local_50;
  
  pAVar1 = type;
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,(int)type)
  ;
  (anonymous_namespace)::generateTestName_abi_cxx11_
            (&local_70,(_anonymous_namespace_ *)type,(AttribType *)(ulong)(uint)arraySize,
             (int)pAVar1);
  tcu::TestCase::TestCase
            (&this->super_TestCase,testCtx,local_50._M_dataplus._M_p,local_70._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_TestCase).super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BindAttributeTest_00c42d50;
  this->m_renderCtx = renderCtx;
  AttributeLocationTestUtil::AttribType::AttribType(&this->m_type,type);
  this->m_arraySize = arraySize;
  return;
}

Assistant:

BindAttributeTest::BindAttributeTest (tcu::TestContext&		testCtx,
									  glu::RenderContext&	renderCtx,
									  const AttribType&		type,
									  int					arraySize)
	: TestCase		(testCtx, generateTestName(type, arraySize).c_str(), generateTestName(type, arraySize).c_str())
	, m_renderCtx	(renderCtx)
	, m_type		(type)
	, m_arraySize	(arraySize)
{
}